

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

int lj_lex_setup(lua_State *L,LexState *ls)

{
  byte *pbVar1;
  bool bVar2;
  GCstr *pGVar3;
  undefined8 *in_RSI;
  lua_State *in_RDI;
  int header;
  int in_stack_ffffffffffffff3c;
  LexState *in_stack_ffffffffffffff40;
  LexState *in_stack_ffffffffffffff48;
  TValue *pTVar4;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  int local_84;
  
  bVar2 = false;
  in_RSI[1] = in_RDI;
  *in_RSI = 0;
  in_RSI[4] = 0;
  in_RSI[5] = 0;
  in_RSI[0x10] = 0;
  *(undefined4 *)(in_RSI + 0x11) = 0;
  *(undefined4 *)((long)in_RSI + 0x8c) = 0;
  in_RSI[0x12] = 0;
  *(undefined4 *)(in_RSI + 0x13) = 0;
  *(undefined4 *)((long)in_RSI + 0x34) = 0;
  *(undefined4 *)(in_RSI + 7) = 0x121;
  *(undefined4 *)(in_RSI + 0xc) = 1;
  *(undefined4 *)((long)in_RSI + 100) = 1;
  *(undefined4 *)(in_RSI + 0x14) = 0;
  if ((ulong)in_RSI[4] < (ulong)in_RSI[5]) {
    pbVar1 = (byte *)in_RSI[4];
    in_RSI[4] = pbVar1 + 1;
    local_a0 = (uint)*pbVar1;
  }
  else {
    local_a0 = lex_more(in_stack_ffffffffffffff48);
  }
  *(uint *)(in_RSI + 6) = local_a0;
  if ((((*(int *)(in_RSI + 6) == 0xef) && (in_RSI[4] + 2 <= (ulong)in_RSI[5])) &&
      (*(char *)in_RSI[4] == -0x45)) && (*(char *)(in_RSI[4] + 1) == -0x41)) {
    in_RSI[4] = in_RSI[4] + 2;
    if ((ulong)in_RSI[4] < (ulong)in_RSI[5]) {
      pbVar1 = (byte *)in_RSI[4];
      in_RSI[4] = pbVar1 + 1;
      local_a4 = (uint)*pbVar1;
    }
    else {
      local_a4 = lex_more(in_stack_ffffffffffffff48);
    }
    *(uint *)(in_RSI + 6) = local_a4;
    bVar2 = true;
  }
  if (*(int *)(in_RSI + 6) == 0x23) {
    do {
      if ((ulong)in_RSI[4] < (ulong)in_RSI[5]) {
        pbVar1 = (byte *)in_RSI[4];
        in_RSI[4] = pbVar1 + 1;
        local_a8 = (uint)*pbVar1;
      }
      else {
        local_a8 = lex_more(in_stack_ffffffffffffff48);
      }
      *(uint *)(in_RSI + 6) = local_a8;
      if (*(int *)(in_RSI + 6) == -1) {
        return 0;
      }
      in_stack_ffffffffffffff57 = true;
      if (*(int *)(in_RSI + 6) != 10) {
        in_stack_ffffffffffffff57 = *(int *)(in_RSI + 6) == 0xd;
      }
    } while (((in_stack_ffffffffffffff57 ^ 0xff) & 1) != 0);
    lex_newline(in_stack_ffffffffffffff40);
    bVar2 = true;
  }
  if (*(int *)(in_RSI + 6) == 0x1b) {
    if (bVar2) {
      pTVar4 = in_RDI->top;
      in_RDI->top = pTVar4 + 1;
      pGVar3 = lj_err_str((lua_State *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50)
                          ,(ErrMsg)((ulong)pTVar4 >> 0x20));
      (pTVar4->u32).lo = (uint32_t)pGVar3;
      (pTVar4->field_2).it = 0xfffffffb;
      lj_err_throw(in_RDI,in_stack_ffffffffffffff3c);
    }
    local_84 = 1;
  }
  else {
    local_84 = 0;
  }
  return local_84;
}

Assistant:

int lj_lex_setup(lua_State *L, LexState *ls)
{
  int header = 0;
  ls->L = L;
  ls->fs = NULL;
  ls->pe = ls->p = NULL;
  ls->vstack = NULL;
  ls->sizevstack = 0;
  ls->vtop = 0;
  ls->bcstack = NULL;
  ls->sizebcstack = 0;
  ls->tok = 0;
  ls->lookahead = TK_eof;  /* No look-ahead token. */
  ls->linenumber = 1;
  ls->lastline = 1;
  ls->endmark = 0;
  lex_next(ls);  /* Read-ahead first char. */
  if (ls->c == 0xef && ls->p + 2 <= ls->pe && (uint8_t)ls->p[0] == 0xbb &&
      (uint8_t)ls->p[1] == 0xbf) {  /* Skip UTF-8 BOM (if buffered). */
    ls->p += 2;
    lex_next(ls);
    header = 1;
  }
  if (ls->c == '#') {  /* Skip POSIX #! header line. */
    do {
      lex_next(ls);
      if (ls->c == LEX_EOF) return 0;
    } while (!lex_iseol(ls));
    lex_newline(ls);
    header = 1;
  }
  if (ls->c == LUA_SIGNATURE[0]) {  /* Bytecode dump. */
    if (header) {
      /*
      ** Loading bytecode with an extra header is disabled for security
      ** reasons. This may circumvent the usual check for bytecode vs.
      ** Lua code by looking at the first char. Since this is a potential
      ** security violation no attempt is made to echo the chunkname either.
      */
      setstrV(L, L->top++, lj_err_str(L, LJ_ERR_BCBAD));
      lj_err_throw(L, LUA_ERRSYNTAX);
    }
    return 1;
  }
  return 0;
}